

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.hpp
# Opt level: O0

vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> * sift::read_test(void)

{
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_RDI;
  string *in_stack_00000028;
  string fn_images_test;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(&local_29);
  read_vectors(in_stack_00000028);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

static std::vector<point_type> read_test() {
    std::string fn_images_test = "sift_query.fvecs";
    return read_vectors(fn_images_test);
  }